

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

void arkInterpFree_Lagrange(void *arkode_mem,ARKInterp I)

{
  long *in_RSI;
  ARKodeMem in_RDI;
  ARKodeMem ark_mem;
  int i;
  N_Vector *in_stack_ffffffffffffffd8;
  int local_14;
  
  if ((in_RDI != (ARKodeMem)0x0) && (in_RSI != (long *)0x0)) {
    if (*in_RSI != 0) {
      if (*(long *)(*in_RSI + 8) != 0) {
        for (local_14 = 0; local_14 < *(int *)*in_RSI; local_14 = local_14 + 1) {
          if (*(long *)(*(long *)(*in_RSI + 8) + (long)local_14 * 8) != 0) {
            arkFreeVec(in_RDI,in_stack_ffffffffffffffd8);
            *(undefined8 *)(*(long *)(*in_RSI + 8) + (long)local_14 * 8) = 0;
          }
        }
        free(*(void **)(*in_RSI + 8));
        *(undefined8 *)(*in_RSI + 8) = 0;
      }
      if (*(long *)(*in_RSI + 0x10) != 0) {
        free(*(void **)(*in_RSI + 0x10));
        *(undefined8 *)(*in_RSI + 0x10) = 0;
      }
      in_RDI->lrw = in_RDI->lrw - (long)(*(int *)*in_RSI + 1);
      in_RDI->liw = in_RDI->liw - (long)(*(int *)*in_RSI + 2);
      free((void *)*in_RSI);
      *in_RSI = 0;
    }
    if (in_RSI[1] != 0) {
      free((void *)in_RSI[1]);
      in_RSI[1] = 0;
    }
    free(in_RSI);
  }
  return;
}

Assistant:

void arkInterpFree_Lagrange(void* arkode_mem, ARKInterp I)
{
  int i;
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return;
  ark_mem = (ARKodeMem) arkode_mem;

  /* if interpolation structure is NULL, just return */
  if (I == NULL) return;

  /* free content */
  if (I->content != NULL) {
    if (LINT_YHIST(I) != NULL) {
      for (i=0; i<LINT_NMAX(I); i++) {
        if (LINT_YJ(I,i) != NULL) {
          arkFreeVec(ark_mem, &(LINT_YJ(I,i)));
          LINT_YJ(I,i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
    if (LINT_THIST(I) != NULL) {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }

    /* update work space sizes */
    ark_mem->lrw -= (LINT_NMAX(I) + 1);
    ark_mem->liw -= (LINT_NMAX(I) + 2);

    free(I->content);
    I->content = NULL;
  }

  /* free ops and interpolation structures */
  if (I->ops) {
    free(I->ops);
    I->ops = NULL;
  }
  free(I);
  I = NULL;

  return;
}